

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ProfilingHelpers.cpp
# Opt level: O1

void dummy_ProfiledLdRootFld(void)

{
  return;
}

Assistant:

Var ProfilingHelpers::ProfiledLdRootFldForTypeOf_Jit(
        const Var instance,
        const PropertyId propertyId,
        const InlineCacheIndex inlineCacheIndex,
        void *const framePointer)
    {
        JIT_HELPER_REENTRANT_HEADER(ProfiledLdRootFldForTypeOf);
        ScriptFunction *const scriptFunction =
            UnsafeVarTo<ScriptFunction>(JavascriptCallStackLayout::FromFramePointer(framePointer)->functionObject);

        return ProfiledLdFldForTypeOf<true, false, false>(
            instance,
            propertyId,
            GetInlineCache(scriptFunction, inlineCacheIndex),
            inlineCacheIndex,
            scriptFunction->GetFunctionBody());
        JIT_HELPER_END(ProfiledLdRootFldForTypeOf);
    }